

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O2

void __thiscall Calculator::parse(Calculator *this,String *e)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  Stack<Calculator::Token> *this_00;
  byte b;
  char cVar2;
  Token *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  String *this_01;
  Array<Calculator::Token> *this_02;
  bool bVar11;
  char c;
  Calculator *local_d8;
  Array<Calculator::Token> *local_d0;
  Token local_c8;
  anon_union_16_2_78e7fdac_for_String_2 *local_a0;
  String *local_98;
  long local_90;
  long local_88;
  Token *local_80;
  String e1;
  String name;
  String local_48;
  
  asl::Array<Calculator::Token>::clear(&this->_input);
  local_d0 = &this->_output;
  local_d8 = this;
  asl::Array<Calculator::Token>::clear(local_d0);
  asl::String::operator+(&e1,e,' ');
  if (e1._size == 0) {
    e1.field_2._str = (char *)&e1.field_2;
  }
  name._size = 0;
  name._len = 0;
  name.field_2._space[0] = '\0';
  iVar4 = 0;
  paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)e1.field_2._str;
LAB_0010787a:
  b = paVar7->_space[0];
  if (b != 0) {
    paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar7 + 1);
    c = b;
    if (iVar4 == 4) {
      if ((((9 < (byte)(b - 0x30)) && (b != 0x65)) && (b != 0x2e)) &&
         ((b != 0x2d || (*(byte *)((long)paVar7 + -1) != 0x65)))) {
        local_c8.x = asl::String::operator_cast_to_double(&name);
        local_c8.val._size = 0;
        local_c8.val._len = 0;
        local_c8.val.field_2._space[0] = '\0';
        local_c8.type = NUMBER;
        asl::Array<Calculator::Token>::operator<<(&local_d8->_input,&local_c8);
        goto LAB_0010798b;
      }
      asl::String::operator+=(&name,b);
      iVar4 = 4;
      paVar7 = paVar1;
    }
    else if (iVar4 == 3) {
      iVar4 = isalnum((int)(char)b);
      if (iVar4 == 0) {
        asl::String::String(&local_c8.val,&name);
        local_c8.type = NAME;
        asl::Array<Calculator::Token>::operator<<(&local_d8->_input,&local_c8);
LAB_0010798b:
        asl::String::~String(&local_c8.val);
        iVar4 = 0;
      }
      else {
        asl::String::operator+=(&name,b);
        iVar4 = 3;
        paVar7 = paVar1;
      }
    }
    else {
      paVar7 = paVar1;
      if (iVar4 == 0) {
        uVar9 = b - 0x28;
        if (uVar9 < 0x37) {
          if ((0x400000000000acU >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
            if ((3UL >> ((ulong)uVar9 & 0x3f) & 1) == 0) goto LAB_001079f1;
            asl::String::String(&local_48,b);
            asl::String::String(&local_c8.val,&local_48);
            local_c8.type = SEP;
            asl::Array<Calculator::Token>::operator<<(&local_d8->_input,&local_c8);
            asl::String::~String(&local_c8.val);
            this_01 = &local_48;
          }
          else {
            Token::Token(&local_c8,b);
            asl::Array<Calculator::Token>::operator<<(&local_d8->_input,&local_c8);
            this_01 = &local_c8.val;
          }
          asl::String::~String(this_01);
        }
        else {
LAB_001079f1:
          if ((byte)(b - 0x30) < 10 || (byte)(b - 0x2d) < 2) {
            asl::String::operator=(&name,&c);
            iVar4 = 4;
            goto LAB_0010787a;
          }
          iVar4 = isalpha((int)(char)b);
          if (iVar4 != 0) {
            asl::String::operator=(&name,&c);
            iVar4 = 3;
            goto LAB_0010787a;
          }
        }
        iVar4 = 0;
      }
    }
    goto LAB_0010787a;
  }
  this_00 = &local_d8->_operators;
  uVar9 = 1;
  c = '\0';
  for (uVar10 = (ulong)*(uint *)((long)&(local_d8->_input)._a[-1].val.field_2 + 8) << 0x20;
      (uVar9 != 0 && (iVar4 = (int)uVar10, iVar4 < (int)(uVar10 >> 0x20)));
      uVar10 = uVar10 & 0xffffffff00000000 | (ulong)(iVar4 + 1)) {
    pTVar3 = (local_d8->_input)._a;
    local_80 = pTVar3 + iVar4;
    local_98 = &pTVar3[iVar4].val;
    local_a0 = &pTVar3[iVar4].val.field_2;
    local_90 = ((long)((uVar10 << 0x20) + -0x100000000) >> 0x20) * 0x28;
    local_88 = ((long)((uVar10 << 0x20) + 0x100000000) >> 0x20) * 0x28;
LAB_00107ad4:
    if (0 < (int)uVar9) {
switchD_00107b09_default:
      bVar11 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar11) goto LAB_00107cf6;
      this_02 = local_d0;
      switch(local_80->type) {
      case OP:
        paVar7 = local_a0;
        if (local_98->_size != 0) {
          paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)local_a0->_str;
        }
        cVar2 = paVar7->_space[0];
        if ((cVar2 != '-') ||
           (((iVar4 != 0 &&
             (pTVar3 = (local_d8->_input)._a, *(int *)((long)&pTVar3->type + local_90) != 1)) &&
            (bVar11 = asl::String::operator==((String *)((long)&(pTVar3->val)._size + local_90),'(')
            , !bVar11)))) {
          while( true ) {
            pTVar3 = (this_00->super_Array<Calculator::Token>)._a;
            lVar8 = (long)*(int *)((long)&pTVar3[-1].val.field_2 + 8);
            this_02 = &this_00->super_Array<Calculator::Token>;
            if ((lVar8 < 1) ||
               (bVar11 = asl::String::operator!=(&pTVar3[lVar8 + -1].val,'('), !bVar11)) break;
            iVar5 = precedence(local_98);
            pTVar3 = (this_00->super_Array<Calculator::Token>)._a;
            iVar6 = precedence(&pTVar3[(long)*(int *)((long)&pTVar3[-1].val.field_2 + 8) + -1].val);
            if (cVar2 == '^') {
              if (iVar6 <= iVar5) break;
            }
            else if (iVar6 < iVar5) break;
            asl::Stack<Calculator::Token>::popget(&local_c8,this_00);
            asl::Array<Calculator::Token>::operator<<(local_d0,&local_c8);
            asl::String::~String(&local_c8.val);
          }
          goto switchD_00107b09_caseD_4;
        }
        Token::Token(&local_c8,'_');
        asl::Array<Calculator::Token>::operator<<
                  (&this_00->super_Array<Calculator::Token>,&local_c8);
        break;
      case SEP:
        paVar7 = local_a0;
        if (local_98->_size != 0) {
          paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)local_a0->_str;
        }
        if (paVar7->_space[0] != '(') {
          if (paVar7->_space[0] == ')') {
            while (pTVar3 = (this_00->super_Array<Calculator::Token>)._a,
                  bVar11 = asl::String::operator!=
                                     (&pTVar3[(long)*(int *)((long)&pTVar3[-1].val.field_2 + 8) + -1
                                             ].val,'('), bVar11) {
              asl::Stack<Calculator::Token>::popget(&local_c8,this_00);
              asl::Array<Calculator::Token>::operator<<(local_d0,&local_c8);
              asl::String::~String(&local_c8.val);
            }
            asl::Stack<Calculator::Token>::pop(this_00);
          }
          goto switchD_00107b09_default;
        }
        Token::Token(&local_c8,'(');
        asl::Array<Calculator::Token>::operator<<
                  (&this_00->super_Array<Calculator::Token>,&local_c8);
        break;
      case NAME:
        pTVar3 = (local_d8->_input)._a;
        if ((*(int *)((long)&pTVar3->type + local_88) == 2) &&
           (bVar11 = asl::String::operator==((String *)((long)&(pTVar3->val)._size + local_88),'('),
           this_02 = &this_00->super_Array<Calculator::Token>, !bVar11)) {
          this_02 = local_d0;
        }
      case NUMBER:
switchD_00107b09_caseD_4:
        asl::Array<Calculator::Token>::operator<<(this_02,local_80);
      default:
        goto switchD_00107b09_default;
      }
      asl::String::~String(&local_c8.val);
      goto switchD_00107b09_default;
    }
    uVar9 = ~uVar9;
  }
  do {
    pTVar3 = (this_00->super_Array<Calculator::Token>)._a;
    lVar8 = (long)*(int *)((long)&pTVar3[-1].val.field_2 + 8);
    if (lVar8 < 1) {
LAB_00107d9b:
      asl::String::~String(&name);
      asl::String::~String(&e1);
      return;
    }
    bVar11 = asl::String::operator==(&pTVar3[lVar8 + -1].val,'(');
    if ((bVar11) ||
       (pTVar3 = (this_00->super_Array<Calculator::Token>)._a,
       bVar11 = asl::String::operator==
                          (&pTVar3[(long)*(int *)((long)&pTVar3[-1].val.field_2 + 8) + -1].val,')'),
       bVar11)) {
      puts("Mismatch");
      goto LAB_00107d9b;
    }
    asl::Stack<Calculator::Token>::popget(&local_c8,this_00);
    asl::Array<Calculator::Token>::operator<<(local_d0,&local_c8);
    asl::String::~String(&local_c8.val);
  } while( true );
LAB_00107cf6:
  uVar9 = 0xfffffffe;
  goto LAB_00107ad4;
}

Assistant:

void Calculator::parse(const String& e)
{
	_input.clear();
	_output.clear();
	String e1 = e + ' ';
	const char* p = e1;
	String name;
	TokenType type = NONE;
	while (char c = *p++)
	{
		switch (type) {
		case NONE:
			switch (c)
			{
			case '+': case '-': case '*': case '/': case '^':
				_input << c;
				break;
			case '(': case ')':
				_input << Token(SEP, String(c));
				break;
			default:
				if ((c >= '0' && c <= '9') || c == '.' || c == '-') {
					type = NUMBER;
					name = c;
				}
				else if (isalpha(c)) {
					type = NAME;
					name = c;
				}
				break;
			}
			break;
		case NUMBER:
			if (!((c >= '0' && c <= '9') || c == '.' || c == 'e' || (c=='-' && *(p-2)=='e'))) {
				_input << Token((double)name);
				type = NONE;
				p--;
				break;
			}
			else
				name << c;
			break;
		case NAME:
			if (isalnum(c))
				name << c;
			else
			{
				_input << Token(NAME, name);
				p--;
				type = NONE;
			}
			break;
		default:
			break;
		}
	}

	// build reverse

	foreach2(int i, const Token& token, _input)
	{
		char op;
		switch (token.type)
		{
		case NUMBER: _output << token;
			break;
		case NAME:
			if (_input[i + 1].type == SEP && _input[i + 1].val == '(')
				_operators.push(token);
			else
				_output << token;
			break;
		case SEP:
			op = token.val[0];
			switch (op)
			{
			case '(': _operators.push(op);
				break;
			case ')':
				while (_operators.top().val != '(')
					_output << _operators.popget();
				_operators.pop();
				break;
			}
			break;

		case OP:
			op = token.val[0];
			if (op == '-' && (i == 0 || _input[i - 1].type == OP || _input[i - 1].val == '('))
			{
				_operators.push('_');
				break;
			}
			while (_operators.length() > 0 && _operators.top().val != '(' && (
				(op != '^' && precedence(token.val) <= precedence(_operators.top().val)) ||
				(op == '^' && precedence(token.val) < precedence(_operators.top().val))))
				_output << _operators.popget();
			_operators.push(token);
		default:
			break;
		}
	}

	while (_operators.length() > 0)
	{
		if (_operators.top().val == '(' || _operators.top().val == ')') {
			printf("Mismatch\n");
			return;
		}
		else
			_output << _operators.popget();
	}
}